

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O2

void __thiscall
SimpleVector<MiniScript::InputBufferEntry>::push_back
          (SimpleVector<MiniScript::InputBufferEntry> *this,InputBufferEntry *item)

{
  ulong uVar1;
  ulong uVar2;
  
  while( true ) {
    uVar1 = this->mBufItems;
    if (this->mQtyItems < uVar1) break;
    uVar2 = this->mBlockItems;
    if (this->mBlockItems == 0) {
      uVar2 = uVar1;
    }
    if (uVar2 < 0x11) {
      uVar2 = 0x10;
    }
    resizeBuffer(this,uVar2 + uVar1);
  }
  this->mBuf[this->mQtyItems] = *item;
  this->mQtyItems = this->mQtyItems + 1;
  return;
}

Assistant:

inline void SimpleVector<T>::push_back(const T& item)
{
	// do we need to increase the buffer size?
	while (mQtyItems >= mBufItems) {
		// yes -- expand it by one block (should never need more than that!),
		// or by double the size
		unsigned long expandBy = (mBlockItems > 0 ? mBlockItems : mBufItems);
		if (expandBy < 16) expandBy = 16;
		resizeBuffer( mBufItems + expandBy );
	}
	// stuff the item
	mBuf[mQtyItems] = item;
	mQtyItems++;
}